

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

node * mpt::node::create(char *ident,int len)

{
  size_t sVar1;
  node *pnVar2;
  size_t len_00;
  
  if (len < 0) {
    if (ident == (char *)0x0) {
      len_00 = 0;
    }
    else {
      sVar1 = strlen(ident);
      len = (int)sVar1;
      len_00 = (size_t)(len + 1);
    }
  }
  else {
    len_00 = (size_t)(len + 1);
  }
  pnVar2 = create(len_00);
  if (pnVar2 != (node *)0x0) {
    identifier::set_name(&pnVar2->ident,ident,len);
  }
  return pnVar2;
}

Assistant:

node *node::create(const char *ident, int len)
{
	size_t need;
	if (len < 0) {
		need = ident ? (len = strlen(ident)) + 1 : 0;
	} else {
		need = len + 1;
	}
	node *n;
	// identifier in extended node data only
	if (!(n = create(need))) {
		return 0;
	}
	n->ident.set_name(ident, len);
	return n;
}